

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O0

semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_semiintersect_iterator<std::initializer_list<int>,std::initializer_list<int>,std::initializer_list<int>,int,std::less<void>>
          (semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          tuple<std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
          *ranges,tuple<std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
                  *param_4)

{
  vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
  local_a0;
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>
  local_88;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  make_range_vector_t local_40 [8];
  tuple<std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
  common_ranges;
  int min_items_local;
  tuple<std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
  *ranges_local;
  
  common_ranges.
  super__Tuple_impl<0UL,_std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
  .super__Head_base<0UL,_std::initializer_list<int>_&,_false>._M_head_impl._4_4_ = SUB84(ranges,0);
  local_48 = *(undefined8 *)(this + 0x10);
  local_58 = *(undefined8 *)this;
  uStack_50 = *(undefined8 *)(this + 8);
  detail::
  uniform_range_tuple_please<std::initializer_list<int>,std::initializer_list<int>,std::initializer_list<int>>
            ((tuple<std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
              *)local_40,(detail *)&local_58,ranges);
  apply<burst::make_range_vector_t_const&,std::tuple<std::initializer_list<int>&,std::initializer_list<int>&,std::initializer_list<int>&>&>
            (&local_a0,(burst *)&make_range_vector,local_40,param_4);
  own_as_range_t::operator()(&local_88,(own_as_range_t *)&own_as_range,&local_a0);
  make_semiintersect_iterator<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>>,int,std::less<void>>
            (__return_storage_ptr__,(burst *)&local_88,
             common_ranges.
             super__Tuple_impl<0UL,_std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
             .super__Head_base<0UL,_std::initializer_list<int>_&,_false>._M_head_impl._4_4_);
  boost::
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>
  ::~iterator_range(&local_88);
  std::
  vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>::
  ~vector(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

auto
        make_semiintersect_iterator
        (
            std::tuple<Ranges &...> ranges,
            Integral min_items,
            Compare compare
        )
    {
        auto common_ranges = detail::uniform_range_tuple_please(ranges);
        return
            make_semiintersect_iterator
            (
                burst::own_as_range(burst::apply(burst::make_range_vector, common_ranges)),
                min_items,
                std::move(compare)
            );
    }